

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O1

void __thiscall DFraggleThinker::AddRunningScript(DFraggleThinker *this,DRunningScript *runscr)

{
  DRunningScript *pDVar1;
  DObject *pDVar2;
  
  (runscr->next).field_0 = (((this->RunningScripts).field_0.p)->next).field_0;
  pDVar1 = (this->RunningScripts).field_0.p;
  if ((pDVar1 != (DRunningScript *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0)) {
    (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
    pDVar1 = (DRunningScript *)0x0;
  }
  pDVar2 = (pDVar1->next).field_0.o;
  if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
    (pDVar1->next).field_0.p = (DRunningScript *)0x0;
    pDVar2 = (DObject *)0x0;
  }
  if (((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 3) != 0)) &&
     (((runscr->super_DObject).ObjectFlags & 4) != 0)) {
    GC::Barrier(&runscr->super_DObject,pDVar2);
  }
  (runscr->prev).field_0 = (this->RunningScripts).field_0;
  pDVar2 = (this->RunningScripts).field_0.o;
  if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
    (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
    pDVar2 = (DObject *)0x0;
  }
  if (((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 3) != 0)) &&
     (((runscr->super_DObject).ObjectFlags & 4) != 0)) {
    GC::Barrier(&runscr->super_DObject,pDVar2);
  }
  (((runscr->prev).field_0.p)->next).field_0.p = runscr;
  pDVar2 = (runscr->prev).field_0.o;
  if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
    (runscr->prev).field_0.p = (DRunningScript *)0x0;
    pDVar2 = (DObject *)0x0;
  }
  if (((runscr != (DRunningScript *)0x0) && (((runscr->super_DObject).ObjectFlags & 3) != 0)) &&
     ((pDVar2->ObjectFlags & 4) != 0)) {
    GC::Barrier(pDVar2,&runscr->super_DObject);
  }
  pDVar1 = (runscr->next).field_0.p;
  if (pDVar1 != (DRunningScript *)0x0) {
    if (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0) {
      (((runscr->next).field_0.p)->prev).field_0.p = runscr;
      pDVar2 = (runscr->next).field_0.o;
      if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
        (runscr->next).field_0.p = (DRunningScript *)0x0;
        pDVar2 = (DObject *)0x0;
      }
      if (((runscr != (DRunningScript *)0x0) && (((runscr->super_DObject).ObjectFlags & 3) != 0)) &&
         ((pDVar2->ObjectFlags & 4) != 0)) {
        GC::Barrier(pDVar2,&runscr->super_DObject);
        return;
      }
    }
    else {
      (runscr->next).field_0.p = (DRunningScript *)0x0;
    }
  }
  return;
}

Assistant:

void DFraggleThinker::AddRunningScript(DRunningScript *runscr)
{
	runscr->next = RunningScripts->next;
	GC::WriteBarrier(runscr, RunningScripts->next);

	runscr->prev = RunningScripts;
	GC::WriteBarrier(runscr, RunningScripts);

	runscr->prev->next = runscr;
	GC::WriteBarrier(runscr->prev, runscr);

	if(runscr->next)
	{
		runscr->next->prev = runscr;
		GC::WriteBarrier(runscr->next, runscr);
	}
}